

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJWriter.cc
# Opt level: O2

size_t __thiscall OpenMesh::IO::_OBJWriter_::getMaterial(_OBJWriter_ *this,Vec4f _color)

{
  pointer pVVar1;
  bool bVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  undefined1 local_48 [8];
  Vec4f _color_local;
  
  _color_local.super_VectorDataT<float,_4>.field_0._0_8_ =
       _color.super_VectorDataT<float,_4>.field_0._8_8_;
  local_48 = _color.super_VectorDataT<float,_4>.field_0._0_8_;
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    pVVar1 = (this->materialA_).
             super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->materialA_).
                      super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4) <= uVar4) {
      std::vector<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>::
      push_back(&this->materialA_,(value_type *)local_48);
      return ((long)(this->materialA_).
                    super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->materialA_).
                    super__Vector_base<OpenMesh::VectorT<float,_4>,_std::allocator<OpenMesh::VectorT<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    }
    bVar2 = VectorT<float,_4>::operator==
                      ((VectorT<float,_4> *)
                       ((long)&(pVVar1->super_VectorDataT<float,_4>).field_0 + lVar3),
                       (vector_type *)local_48);
    if (bVar2) break;
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x10;
  }
  return uVar4;
}

Assistant:

size_t _OBJWriter_::getMaterial(OpenMesh::Vec4f _color) const
{
  for (size_t i=0; i < materialA_.size(); i++)
    if(materialA_[i] == _color)
      return i;

  //not found add new material
  materialA_.push_back( _color );
  return materialA_.size()-1;
}